

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue JS_RegExpDelete(JSContext *ctx,JSValue this_val,JSValue arg)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int64_t iVar5;
  long lVar6;
  uint8_t *cbuf;
  uint32_t from;
  ulong uVar7;
  JSValueUnion JVar8;
  uint32_t to;
  JSValue v;
  JSValue JVar9;
  JSValue JVar10;
  JSValue JVar11;
  int end;
  uint8_t **local_b0;
  uint local_94;
  JSValueUnion local_90;
  int64_t local_88;
  uint32_t local_80;
  int local_7c;
  JSValueUnion local_78;
  JSString *local_70;
  ulong local_68;
  undefined8 uStack_60;
  uint8_t *local_58;
  uint8_t *local_50;
  JSValueUnion local_48;
  JSValueUnion local_40;
  ulong local_38;
  JSValueUnion p;
  
  local_78 = this_val.u;
  if (((int)this_val.tag == -1) && (*(short *)((long)local_78.ptr + 6) == 0x12)) {
    lVar6 = (long)local_78.ptr + 0x30;
  }
  else {
    JS_ThrowTypeErrorInvalidClass(ctx,0x12);
    lVar6 = 0;
  }
  iVar5 = 6;
  if (lVar6 == 0) {
    uVar4 = 0;
    uVar7 = 0;
    goto LAB_001439f5;
  }
  local_68 = 0;
  uStack_60 = 0;
  local_78 = (JSValueUnion)ctx;
  local_70 = js_alloc_string(ctx,0,0);
  if (local_70 == (JSString *)0x0) {
    local_68 = local_68 & 0xffffffff;
    uStack_60 = CONCAT44(0xffffffff,(undefined4)uStack_60);
  }
  local_b0 = (uint8_t **)0x0;
  JVar10 = JS_ToStringInternal(ctx,arg,0);
  v.tag = JVar10.tag;
  p = JVar10.u;
  local_48 = p;
  if ((int)JVar10.tag != 6) {
    local_50 = (uint8_t *)(*(long *)(lVar6 + 8) + 0x10);
    uVar1 = lre_get_flags(local_50);
    if ((uVar1 & 0x21) == 0) {
      local_88 = 0;
    }
    else {
      JVar11 = JS_GetPropertyInternal(ctx,this_val,0x55,this_val,0);
      if (((int)JVar11.tag == 6) || (iVar2 = JS_ToLengthFree(ctx,&local_88,JVar11), iVar2 != 0)) {
        local_b0 = (uint8_t **)0x0;
        goto LAB_00143c78;
      }
    }
    local_90 = p;
    uVar3 = lre_get_capture_count(local_50);
    from = 0;
    if ((int)uVar3 < 1) {
      local_b0 = (uint8_t **)0x0;
    }
    else {
      local_b0 = (uint8_t **)js_malloc(ctx,(ulong)uVar3 << 4);
      if (local_b0 == (uint8_t **)0x0) {
        local_b0 = (uint8_t **)0x0;
LAB_00143b12:
        JVar10.tag = v.tag;
        JVar10.u.float64 = local_90.float64;
        goto LAB_00143c78;
      }
    }
    uVar4 = *(ulong *)((long)p.ptr + 4);
    JVar8 = local_90;
    lVar6 = local_88;
    if (local_88 <= (long)(ulong)((uint)uVar4 & 0x7fffffff)) {
      local_38 = uVar4 >> 0x1f & 1;
      cbuf = (uint8_t *)((long)p.ptr + 0x10);
      local_7c = (int)local_38;
      uVar7 = 0;
      local_58 = cbuf;
      do {
        local_80 = (uint32_t)uVar7;
        iVar2 = lre_exec(local_b0,local_50,cbuf,(int)lVar6,(uint)uVar4 & 0x7fffffff,local_7c,ctx);
        from = local_80;
        JVar8 = local_90;
        if (iVar2 != 1) {
          local_88 = lVar6;
          if (iVar2 < 0) {
            JS_ThrowInternalError(ctx,"out of memory in regexp execution");
            goto LAB_00143b12;
          }
          if (((uVar1 & 0x21) != 0) || (iVar2 == 2)) {
            iVar2 = JS_SetPropertyInternal(ctx,this_val,0x55,(JSValue)ZEXT816(0),0x4000);
joined_r0x00143dea:
            JVar10.tag = v.tag;
            JVar10.u.ptr = JVar8.ptr;
            lVar6 = local_88;
            if (iVar2 < 0) goto LAB_00143c78;
          }
          break;
        }
        uVar7 = (long)local_b0[1] - (long)cbuf >> ((byte)local_38 & 0x3f);
        from = (uint32_t)uVar7;
        to = (uint32_t)((long)*local_b0 - (long)cbuf >> ((byte)local_38 & 0x3f));
        local_94 = from;
        if (((int)local_80 < (int)to) &&
           (iVar2 = string_buffer_concat((StringBuffer *)&local_78,(JSString *)p.ptr,local_80,to),
           cbuf = local_58, iVar2 != 0)) {
          local_88 = (int64_t)(int)from;
          goto LAB_00143b12;
        }
        if ((uVar1 & 1) == 0) {
          local_88 = (int64_t)(int)from;
          JVar11.u = uVar7 & 0xffffffff;
          JVar11.tag = 0;
          iVar2 = JS_SetPropertyInternal(ctx,this_val,0x55,JVar11,0x4000);
          JVar8 = local_90;
          goto joined_r0x00143dea;
        }
        if (from == to) {
          if ((((uVar1 & 0x10) == 0) || (-1 < (int)*(uint *)((long)p.ptr + 4))) ||
             ((*(uint *)((long)p.ptr + 4) & 0x7fffffff) <= from)) {
            local_94 = from + 1;
          }
          else {
            string_getc((JSString *)p.ptr,(int *)&local_94);
            cbuf = local_58;
          }
        }
        lVar6 = (long)(int)local_94;
        uVar4 = *(ulong *)((long)p.ptr + 4);
        JVar8 = local_90;
      } while (lVar6 <= (long)(ulong)((uint)uVar4 & 0x7fffffff));
    }
    local_88 = lVar6;
    JVar10.tag = v.tag;
    JVar10.u.ptr = JVar8.ptr;
    iVar2 = string_buffer_concat
                      ((StringBuffer *)&local_78,(JSString *)p.ptr,from,
                       *(uint *)((long)p.ptr + 4) & 0x7fffffff);
    if (iVar2 == 0) {
      v.u.float64 = local_48.float64;
      JS_FreeValue(ctx,v);
      (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,local_b0);
      JVar10 = string_buffer_end((StringBuffer *)&local_78);
      iVar5 = JVar10.tag;
      uVar7 = (ulong)JVar10.u.ptr & 0xffffffff00000000;
      uVar4 = (ulong)JVar10.u._0_4_;
      goto LAB_001439f5;
    }
  }
LAB_00143c78:
  local_40 = JVar10.u;
  if ((0xfffffff4 < (uint)JVar10.tag) &&
     (iVar2 = *local_40.ptr, *(int *)local_40.ptr = iVar2 + -1, iVar2 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar10);
  }
  (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,local_b0);
  (*((*(JSRuntime **)((long)local_78.ptr + 0x18))->mf).js_free)
            (&(*(JSRuntime **)((long)local_78.ptr + 0x18))->malloc_state,local_70);
  uVar4 = 0;
  uVar7 = 0;
  iVar5 = 6;
LAB_001439f5:
  JVar9.u.ptr = (void *)(uVar4 | uVar7);
  JVar9.tag = iVar5;
  return JVar9;
}

Assistant:

static JSValue JS_RegExpDelete(JSContext *ctx, JSValueConst this_val, JSValueConst arg)
{
    JSRegExp *re = js_get_regexp(ctx, this_val, TRUE);
    JSString *str;
    JSValue str_val, val;
    uint8_t *re_bytecode;
    int ret;
    uint8_t **capture, *str_buf;
    int capture_count, shift, re_flags;
    int next_src_pos, start, end;
    int64_t last_index;
    StringBuffer b_s, *b = &b_s;

    if (!re)
        return JS_EXCEPTION;

    string_buffer_init(ctx, b, 0);

    capture = NULL;
    str_val = JS_ToString(ctx, arg);
    if (JS_IsException(str_val))
        goto fail;
    str = JS_VALUE_GET_STRING(str_val);
    re_bytecode = re->bytecode->u.str8;
    re_flags = lre_get_flags(re_bytecode);
    if ((re_flags & (LRE_FLAG_GLOBAL | LRE_FLAG_STICKY)) == 0) {
        last_index = 0;
    } else {
        val = JS_GetProperty(ctx, this_val, JS_ATOM_lastIndex);
        if (JS_IsException(val) || JS_ToLengthFree(ctx, &last_index, val))
            goto fail;
    }
    capture_count = lre_get_capture_count(re_bytecode);
    if (capture_count > 0) {
        capture = js_malloc(ctx, sizeof(capture[0]) * capture_count * 2);
        if (!capture)
            goto fail;
    }
    shift = str->is_wide_char;
    str_buf = str->u.str8;
    next_src_pos = 0;
    for (;;) {
        if (last_index > str->len)
            break;

        ret = lre_exec(capture, re_bytecode,
                       str_buf, last_index, str->len, shift, ctx);
        if (ret != 1) {
            if (ret >= 0) {
                if (ret == 2 || (re_flags & (LRE_FLAG_GLOBAL | LRE_FLAG_STICKY))) {
                    if (JS_SetProperty(ctx, this_val, JS_ATOM_lastIndex,
                                       JS_NewInt32(ctx, 0)) < 0)
                        goto fail;
                }
            } else {
                JS_ThrowInternalError(ctx, "out of memory in regexp execution");
                goto fail;
            }
            break;
        }
        start = (capture[0] - str_buf) >> shift;
        end = (capture[1] - str_buf) >> shift;
        last_index = end;
        if (next_src_pos < start) {
            if (string_buffer_concat(b, str, next_src_pos, start))
                goto fail;
        }
        next_src_pos = end;
        if (!(re_flags & LRE_FLAG_GLOBAL)) {
            if (JS_SetProperty(ctx, this_val, JS_ATOM_lastIndex,
                               JS_NewInt32(ctx, end)) < 0)
                goto fail;
            break;
        }
        if (end == start) {
            if (!(re_flags & LRE_FLAG_UTF16) || (unsigned)end >= str->len || !str->is_wide_char) {
                end++;
            } else {
                string_getc(str, &end);
            }
        }
        last_index = end;
    }
    if (string_buffer_concat(b, str, next_src_pos, str->len))
        goto fail;
    JS_FreeValue(ctx, str_val);
    js_free(ctx, capture);
    return string_buffer_end(b);
fail:
    JS_FreeValue(ctx, str_val);
    js_free(ctx, capture);
    string_buffer_free(b);
    return JS_EXCEPTION;
}